

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall ads2_checkItem4_Test::TestBody(ads2_checkItem4_Test *this)

{
  char *message;
  double rhs_value;
  AssertHelper AStack_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  rhs_value = (double)calcItem(2.0,5);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_18,"0.26666666666666666","calcItem(2.0, 5)",0.26666666666666666,rhs_value);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/NNTU-CS[P]ADS-2/test/tests.cpp"
               ,0x29,message);
    testing::internal::AssertHelper::operator=(&AStack_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  return;
}

Assistant:

TEST(ads2, checkItem4) {
  EXPECT_DOUBLE_EQ(0.26666666666666666, calcItem(2.0, 5));
}